

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core.hpp
# Opt level: O1

void __thiscall iutest::UnitTest::UnitTest(UnitTest *this)

{
  Variable *pVVar1;
  
  (this->super_UnitTestImpl).m_total_test_num = 0;
  (this->super_UnitTestImpl).m_disable_num = 0;
  (this->super_UnitTestImpl).m_should_run_num = 0;
  (this->super_UnitTestImpl).m_current_testsuite = (TestSuite *)0x0;
  (this->super_UnitTestImpl).m_elapsedmsec = 0;
  (this->super_UnitTestImpl).m_testsuites.
  super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_UnitTestImpl).m_testsuites.
  super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_UnitTestImpl).m_testsuites.
  super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_UnitTestImpl).m_ad_hoc_testresult.m_test_part_results.
  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_UnitTestImpl).m_ad_hoc_testresult.m_test_part_results.
  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_UnitTestImpl).m_ad_hoc_testresult.m_test_part_results.
  super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_UnitTestImpl).m_ad_hoc_testresult.m_test_propertys.
  super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_UnitTestImpl).m_ad_hoc_testresult.m_test_propertys.
  super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_UnitTestImpl).m_ad_hoc_testresult.m_test_propertys.
  super__Vector_base<iutest::TestProperty,_std::allocator<iutest::TestProperty>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_UnitTestImpl).m_ad_hoc_testresult.m_elapsedmsec = 0;
  UnitTestImpl::ptr()::ptr = this;
  this->m_start_timestamp = 0;
  (this->m_param_testsuite_holder).m_testsuite_infos.
  super__Vector_base<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_param_testsuite_holder).m_testsuite_infos.
  super__Vector_base<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_param_testsuite_holder).m_testsuite_infos.
  super__Vector_base<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_repeat_counter = 0;
  this->m_init_iutest_count = 0;
  this->m_test_started = false;
  (this->m_default_test_part_result_reporter).super_TestPartResultReporterInterface.
  _vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__TestPartResultReporterInterface_001336a0;
  pVVar1 = TestEnv::get_vars();
  pVVar1->m_testpartresult_reporter =
       &(this->m_default_test_part_result_reporter).super_TestPartResultReporterInterface;
  TestEnv::LoadEnvironmentVariable();
  return;
}

Assistant:

UnitTest()
        : m_repeat_counter(0)
        , m_init_iutest_count(0)
        , m_test_started(false)
        , m_start_timestamp(0)
    {
        // デフォルトリポーターをセット
        TestEnv::SetGlobalTestPartResultReporter(&m_default_test_part_result_reporter);
        // 環境変数によるテストフラグ指定をロード
        TestEnv::LoadEnvironmentVariable();
    }